

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ObjLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar5 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  pVVar3 = p->vLevels;
  if ((int)uVar5 < pVVar3->nSize) goto LAB_007a1435;
  iVar6 = uVar5 + 1;
  iVar1 = pVVar3->nCap;
  iVar7 = iVar1 * 2;
  if ((int)uVar5 < iVar7) {
    if (iVar1 < iVar7 && iVar1 <= (int)uVar5) {
      if (pVVar3->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar4 = (int *)realloc(pVVar3->pArray,(long)iVar1 << 3);
      }
      pVVar3->pArray = piVar4;
LAB_007a13ff:
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar3->nCap = iVar7;
    }
  }
  else if (iVar1 <= (int)uVar5) {
    if (pVVar3->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)iVar6 << 2);
    }
    else {
      piVar4 = (int *)realloc(pVVar3->pArray,(long)iVar6 << 2);
    }
    pVVar3->pArray = piVar4;
    iVar7 = iVar6;
    goto LAB_007a13ff;
  }
  iVar1 = pVVar3->nSize;
  if (iVar1 <= (int)uVar5) {
    memset(pVVar3->pArray + iVar1,0,(ulong)(uVar5 - iVar1) * 4 + 4);
  }
  pVVar3->nSize = iVar6;
LAB_007a1435:
  if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar3->nSize)) {
    return pVVar3->pArray[uVar5 & 0x7fffffff];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int          Gia_ObjLevel( Gia_Man_t * p, Gia_Obj_t * pObj )     { return Gia_ObjLevelId( p, Gia_ObjId(p,pObj) );             }